

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,bool once)

{
  xpath_ast_node *this_00;
  xml_attribute_struct *pxVar1;
  bool bVar2;
  xpath_node *pxVar3;
  xpath_node *pxVar4;
  ulong uVar5;
  size_t sVar6;
  xpath_node *it;
  xpath_node *pxVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  xpath_context c;
  xpath_node cn;
  xpath_context local_68;
  xpath_node local_40;
  
  pxVar4 = ns->_begin;
  pxVar3 = ns->_end;
  uVar5 = (long)pxVar3 - (long)pxVar4 >> 4;
  if (uVar5 == first) {
    return;
  }
  if ((this->_type & 0xfeU) != 0x10) {
    __assert_fail("_type == ast_filter || _type == ast_predicate",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x26ff,
                  "void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate(xpath_node_set_raw &, size_t, const xpath_stack &, bool)"
                 );
  }
  this_00 = this->_right;
  if ((this->_test & 0xfeU) == 2) {
    sVar6 = uVar5 - first;
    if (uVar5 < first) {
      __assert_fail("ns.size() >= first",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x26e0,
                    "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                   );
    }
    if (this_00->_rettype != '\x02') {
      __assert_fail("expr->rettype() == xpath_type_number",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x26e1,
                    "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                   );
    }
    pxVar4 = pxVar4 + first;
    xpath_node::xpath_node(&local_40);
    local_68.n._node._root = local_40._node._root;
    local_68.n._attribute._attr = local_40._attribute._attr;
    local_68.position = 1;
    local_68.size = sVar6;
    dVar8 = eval_number(this_00,&local_68,stack);
    if ((1.0 <= dVar8) &&
       (auVar9._8_4_ = (int)(sVar6 >> 0x20), auVar9._0_8_ = sVar6, auVar9._12_4_ = 0x45300000,
       dVar8 <= (auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0))) {
      uVar5 = (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8;
      auVar10._8_4_ = (int)(uVar5 >> 0x20);
      auVar10._0_8_ = uVar5;
      auVar10._12_4_ = 0x45300000;
      dVar12 = (auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
      if ((dVar8 == dVar12) && (!NAN(dVar8) && !NAN(dVar12))) {
        pxVar1 = pxVar4[uVar5 - 1]._attribute._attr;
        (pxVar4->_node)._root = pxVar4[uVar5 - 1]._node._root;
        (pxVar4->_attribute)._attr = pxVar1;
        pxVar4 = pxVar4 + 1;
      }
    }
    if ((ns->_begin <= pxVar4) && (pxVar4 <= ns->_end)) {
      ns->_end = pxVar4;
      return;
    }
    goto LAB_00371090;
  }
  if (this_00->_rettype == '\x02') {
    if (uVar5 < first) {
      __assert_fail("ns.size() >= first",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x26c6,
                    "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                   );
    }
    pxVar7 = pxVar4 + first;
    if (pxVar7 != pxVar3) {
      sVar6 = 1;
      pxVar3 = pxVar7;
      pxVar4 = pxVar7;
      do {
        local_68.n._node._root = (pxVar3->_node)._root;
        local_68.n._attribute._attr = (pxVar3->_attribute)._attr;
        local_68.position = sVar6;
        local_68.size = uVar5 - first;
        dVar8 = eval_number(this_00,&local_68,stack);
        auVar11._8_4_ = (int)(sVar6 >> 0x20);
        auVar11._0_8_ = sVar6;
        auVar11._12_4_ = 0x45300000;
        dVar12 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0);
        if ((dVar8 == dVar12) && (!NAN(dVar8) && !NAN(dVar12))) {
          pxVar1 = (pxVar3->_attribute)._attr;
          (pxVar4->_node)._root = (pxVar3->_node)._root;
          (pxVar4->_attribute)._attr = pxVar1;
          pxVar4 = pxVar4 + 1;
          if (once) goto LAB_00371046;
        }
        pxVar3 = pxVar3 + 1;
        sVar6 = sVar6 + 1;
      } while (pxVar3 != ns->_end);
LAB_0037104a:
      pxVar7 = pxVar4;
      pxVar4 = ns->_begin;
    }
  }
  else {
    if (uVar5 < first) {
      __assert_fail("ns.size() >= first",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x26ac,
                    "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_boolean(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                   );
    }
    pxVar7 = pxVar4 + first;
    if (pxVar7 != pxVar3) {
      sVar6 = 1;
      pxVar4 = pxVar7;
      do {
        local_68.n._node._root = (pxVar7->_node)._root;
        local_68.n._attribute._attr = (pxVar7->_attribute)._attr;
        local_68.position = sVar6;
        local_68.size = uVar5 - first;
        bVar2 = eval_boolean(this_00,&local_68,stack);
        if (bVar2) {
          pxVar1 = (pxVar7->_attribute)._attr;
          (pxVar4->_node)._root = (pxVar7->_node)._root;
          (pxVar4->_attribute)._attr = pxVar1;
          pxVar4 = pxVar4 + 1;
          if (once) goto LAB_00371046;
        }
        pxVar7 = pxVar7 + 1;
        sVar6 = sVar6 + 1;
        pxVar3 = pxVar7;
      } while (pxVar7 != ns->_end);
      goto LAB_0037104a;
    }
  }
  if ((pxVar4 <= pxVar7) && (pxVar7 <= pxVar3)) {
    ns->_end = pxVar7;
    return;
  }
LAB_00371090:
  __assert_fail("_begin <= pos && pos <= _end",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                ,0x23b6,
                "void pugi::impl::(anonymous namespace)::xpath_node_set_raw::truncate(xpath_node *)"
               );
LAB_00371046:
  pxVar3 = ns->_end;
  goto LAB_0037104a;
}

Assistant:

void apply_predicate(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, bool once)
		{
			if (ns.size() == first) return;

			assert(_type == ast_filter || _type == ast_predicate);

			if (_test == predicate_constant || _test == predicate_constant_one)
				apply_predicate_number_const(ns, first, _right, stack);
			else if (_right->rettype() == xpath_type_number)
				apply_predicate_number(ns, first, _right, stack, once);
			else
				apply_predicate_boolean(ns, first, _right, stack, once);
		}